

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O1

v256 * v256_shr_u8(v256 *__return_storage_ptr__,v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  undefined1 auVar4 [16];
  
  auVar2 = pshufb(ZEXT416(0xff >> ((byte)c & 0x1f)),(undefined1  [16])0x0);
  uVar3 = (ulong)c;
  auVar1._0_2_ = (ushort)a.val[1][0] >> uVar3;
  auVar1._2_2_ = a.val[1][0]._2_2_ >> uVar3;
  auVar1._4_2_ = a.val[1][0]._4_2_ >> uVar3;
  auVar1._6_2_ = a.val[1][0]._6_2_ >> uVar3;
  auVar1._8_2_ = (ushort)a.val[1][1] >> uVar3;
  auVar1._10_2_ = a.val[1][1]._2_2_ >> uVar3;
  auVar1._12_2_ = a.val[1][1]._4_2_ >> uVar3;
  auVar1._14_2_ = a.val[1][1]._6_2_ >> uVar3;
  auVar4._0_2_ = (ushort)a.val[0][0] >> uVar3;
  auVar4._2_2_ = a.val[0][0]._2_2_ >> uVar3;
  auVar4._4_2_ = a.val[0][0]._4_2_ >> uVar3;
  auVar4._6_2_ = a.val[0][0]._6_2_ >> uVar3;
  auVar4._8_2_ = (ushort)a.val[0][1] >> uVar3;
  auVar4._10_2_ = a.val[0][1]._2_2_ >> uVar3;
  auVar4._12_2_ = a.val[0][1]._4_2_ >> uVar3;
  auVar4._14_2_ = a.val[0][1]._6_2_ >> uVar3;
  __return_storage_ptr__->val[1] = (v128)(auVar1 & auVar2);
  __return_storage_ptr__->val[0] = (v128)(auVar4 & auVar2);
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE v256 v256_shr_u8(v256 a, const unsigned int c) {
  return v256_from_v128(v128_shr_u8(a.val[1], c), v128_shr_u8(a.val[0], c));
}